

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.c
# Opt level: O3

void worker(void *arg)

{
  char *in_RCX;
  int sock;
  int sock_00;
  
  nn_sleep(100);
  test_send_impl((char *)0x2a,sc,sock,in_RCX);
  nn_sleep(100);
  test_send_impl((char *)0x30,sc,sock_00,in_RCX);
  return;
}

Assistant:

void worker (NN_UNUSED void *arg)
{
    /*  Wait 0.1 sec for the main thread to block. */
    nn_sleep (100);

    test_send (sc, "ABC");

    /*  Wait 0.1 sec for the main thread to process the previous message
        and block once again. */
    nn_sleep (100);

    test_send (sc, "ABC");
}